

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsondocument.cpp
# Opt level: O1

QDebug operator<<(QDebug dbg,QJsonDocument *o)

{
  char *pcVar1;
  QCborValue *other;
  _Head_base<0UL,_QJsonDocumentPrivate_*,_false> _Var2;
  storage_type *in_RCX;
  undefined8 *in_RDX;
  char *pcVar3;
  QString *this;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QDebugStateSaver saver;
  QJsonValue result;
  QByteArray local_68;
  QDebugStateSaver local_50;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_50,(QDebug *)o);
  other = (QCborValue *)*in_RDX;
  if (other == (QCborValue *)0x0) {
    _Var2._M_head_impl =
         (o->d)._M_t.
         super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>.
         _M_t.
         super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
         super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
    ba_01.m_data = in_RCX;
    ba_01.m_size = (qsizetype)"QJsonDocument()";
    QString::fromUtf8(&local_48,(QString *)0xf,ba_01);
    QTextStream::operator<<((QTextStream *)_Var2._M_head_impl,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    _Var2._M_head_impl =
         (o->d)._M_t.
         super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>.
         _M_t.
         super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
         super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
    if (*(char *)&((QTextStream *)(_Var2._M_head_impl + 2))->_vptr_QTextStream == '\x01') {
      QTextStream::operator<<((QTextStream *)_Var2._M_head_impl,' ');
    }
    _Var2._M_head_impl =
         (o->d)._M_t.
         super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>.
         _M_t.
         super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
         super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
    (o->d)._M_t.
    super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
    super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
    super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl = (QJsonDocumentPrivate *)0x0;
    ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)_Var2._M_head_impl;
  }
  else {
    local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QJsonValue::QJsonValue((QJsonValue *)&local_48,Null);
    QCborValue::operator=((QCborValue *)&local_48,other);
    QJsonValue::toJson(&local_68,(QJsonValue *)&local_48,Compact);
    QJsonValue::~QJsonValue((QJsonValue *)&local_48);
    _Var2._M_head_impl =
         (o->d)._M_t.
         super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>.
         _M_t.
         super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
         super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
    *(undefined1 *)&((QTextStream *)(_Var2._M_head_impl + 2))->_vptr_QTextStream = 0;
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)"QJsonDocument(";
    QString::fromUtf8(&local_48,(QString *)0xe,ba);
    QTextStream::operator<<((QTextStream *)_Var2._M_head_impl,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    _Var2._M_head_impl =
         (o->d)._M_t.
         super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>.
         _M_t.
         super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
         super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
    if (*(char *)&((QTextStream *)(_Var2._M_head_impl + 2))->_vptr_QTextStream == '\x01') {
      QTextStream::operator<<((QTextStream *)_Var2._M_head_impl,' ');
    }
    pcVar3 = local_68.d.ptr;
    if (local_68.d.ptr == (char *)0x0) {
      pcVar3 = "";
    }
    _Var2._M_head_impl =
         (o->d)._M_t.
         super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>.
         _M_t.
         super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
         super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
    this = (QString *)0xffffffffffffffff;
    do {
      pcVar1 = pcVar3 + 1 + (long)this;
      this = (QString *)((long)&(this->d).d + 1);
    } while (*pcVar1 != '\0');
    ba_00.m_data = in_RCX;
    ba_00.m_size = (qsizetype)pcVar3;
    QString::fromUtf8(&local_48,this,ba_00);
    QTextStream::operator<<((QTextStream *)_Var2._M_head_impl,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    _Var2._M_head_impl =
         (o->d)._M_t.
         super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>.
         _M_t.
         super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
         super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
    if (*(char *)&((QTextStream *)(_Var2._M_head_impl + 2))->_vptr_QTextStream == '\x01') {
      QTextStream::operator<<((QTextStream *)_Var2._M_head_impl,' ');
    }
    QTextStream::operator<<
              ((QTextStream *)
               (o->d)._M_t.
               super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>
               ._M_t.
               super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>
               .super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl,')');
    _Var2._M_head_impl =
         (o->d)._M_t.
         super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>.
         _M_t.
         super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
         super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
    if (*(char *)&((QTextStream *)(_Var2._M_head_impl + 2))->_vptr_QTextStream == '\x01') {
      QTextStream::operator<<((QTextStream *)_Var2._M_head_impl,' ');
    }
    _Var2._M_head_impl =
         (o->d)._M_t.
         super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>.
         _M_t.
         super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
         super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
    (o->d)._M_t.
    super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
    super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
    super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl = (QJsonDocumentPrivate *)0x0;
    ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)_Var2._M_head_impl;
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  QDebugStateSaver::~QDebugStateSaver(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QJsonDocument &o)
{
    QDebugStateSaver saver(dbg);
    if (!o.d) {
        dbg << "QJsonDocument()";
        return dbg;
    }
    QByteArray json =
        QJsonPrivate::Value::fromTrustedCbor(o.d->value).toJson(QJsonValue::JsonFormat::Compact);
    dbg.nospace() << "QJsonDocument("
                  << json.constData() // print as utf-8 string without extra quotation marks
                  << ')';
    return dbg;
}